

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

fy_node * fy_node_by_path_internal(fy_node *fyn,char *path,size_t pathlen,fy_node_walk_flags flags)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  fy_node *pfVar5;
  long lVar6;
  ushort **ppuVar7;
  void *pvVar8;
  fy_node *fyn_00;
  uint7 uVar10;
  ulong uVar9;
  undefined1 single;
  fy_node_walk_flags fVar11;
  char *pcVar12;
  char *pcVar13;
  fy_node *fyn_01;
  void **ppvVar14;
  void **ppvVar15;
  void **ppvVar16;
  void **ppvVar17;
  int iVar18;
  size_t sVar19;
  char *pcVar20;
  size_t sVar21;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar22;
  char *pcVar23;
  undefined8 uStack_70;
  void *local_68;
  char *local_60;
  char *local_58;
  char *end_idx;
  char *pcStack_48;
  int code_length;
  fy_node *local_40;
  uint local_38;
  fy_node_walk_flags local_34;
  
  ppvVar16 = &local_68;
  ppvVar14 = &local_68;
  ppvVar17 = &local_68;
  ppvVar15 = &local_68;
  uVar10 = (uint7)(uint3)(flags >> 8);
  if (path == (char *)0x0 || fyn == (fy_node *)0x0) {
    return (fy_node *)0x0;
  }
  if (pathlen == 0xffffffffffffffff) {
    uStack_70 = 0x1202af;
    pathlen = strlen(path);
  }
  fVar11 = flags & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON);
  pcVar13 = path + pathlen;
  if (pathlen == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = CONCAT71(uVar10,pcVar13[-1] == '/');
  }
  if (fVar11 == FYNWF_PTR_JSON) {
    if (pathlen == 0) {
      return fyn;
    }
    if (*path != '/') {
      return (fy_node *)0x0;
    }
    pcVar23 = path + 1;
  }
  else {
    pcVar23 = path;
    if (fVar11 != FYNWF_PTR_RELJSON) {
      for (; path < pcVar13; path = path + 1) {
        pcVar23 = path;
        if (*path != '/') goto LAB_001202e6;
      }
      goto LAB_0012082f;
    }
  }
LAB_001202e6:
  uStack_70 = 0x1202f4;
  local_38 = (uint)uVar9;
  pfVar5 = fy_node_follow_aliases(fyn,flags,true);
  path = pcVar23;
  if (pfVar5 == (fy_node *)0x0) {
switchD_00120311_caseD_0:
    fyn = (fy_node *)0x0;
    ppvVar17 = &local_68;
  }
  else {
    switch(pfVar5->field_0x34 & 3) {
    case 0:
      goto switchD_00120311_caseD_0;
    case 1:
      local_40 = pfVar5;
      local_34 = flags;
      if ((fVar11 == FYNWF_PTR_JSON) || (fVar11 == FYNWF_PTR_RELJSON)) {
        if (*pcVar23 == '-') {
          return (fy_node *)0x0;
        }
        uStack_70 = 0x1203ce;
        lVar6 = strtol(pcVar23,&local_58,10);
        iVar18 = (int)lVar6;
        if (iVar18 < 0) {
          return (fy_node *)0x0;
        }
        if (iVar18 == 0 && local_58 == pcVar23) {
          return (fy_node *)0x0;
        }
        path = local_58;
        if (local_58 < pcVar13) {
          path = local_58 + (*local_58 == '/');
        }
      }
      else {
        while( true ) {
          cVar1 = *pcVar23;
          if (pcVar13 <= pcVar23) break;
          uStack_70 = 0x12053c;
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
          pcVar23 = pcVar23 + 1;
        }
        if (cVar1 == '[') {
          pcVar23 = pcVar23 + 1;
        }
        else {
          uStack_70 = 0x120693;
          ppuVar7 = __ctype_b_loc();
          if ((cVar1 != '-') && (((*ppuVar7)[cVar1] & 0x800) == 0)) {
            return (fy_node *)0x0;
          }
        }
        uStack_70 = 0x120573;
        lVar6 = strtol(pcVar23,&local_58,10);
        iVar18 = (int)lVar6;
        path = local_58;
        if (iVar18 == 0 && local_58 == pcVar23) {
          return (fy_node *)0x0;
        }
        for (; path < pcVar13; path = path + 1) {
          uStack_70 = 0x12059b;
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + (long)*path * 2 + 1) & 0x20) == 0) break;
        }
        if (cVar1 != '[') goto LAB_00120861;
        if (*path != ']') {
          return (fy_node *)0x0;
        }
        do {
          path = path + 1;
LAB_00120861:
          if (pcVar13 <= path) break;
          uStack_70 = 0x12086b;
          ppuVar7 = __ctype_b_loc();
        } while ((*(byte *)((long)*ppuVar7 + (long)*path * 2 + 1) & 0x20) != 0);
      }
      sVar19 = (long)pcVar13 - (long)path;
      uStack_70 = 0x12088b;
      pfVar5 = fy_node_sequence_get_by_index(local_40,iVar18);
      ppvVar17 = &local_68;
      flags = local_34;
      if ((byte)local_38 != '\0') {
        single = false;
LAB_0012089d:
        *(undefined8 *)((long)ppvVar15 + -8) = 0x1208a2;
        pfVar5 = fy_node_follow_aliases(pfVar5,flags,(_Bool)single);
        ppvVar17 = ppvVar15;
      }
LAB_001208a8:
      *(undefined8 *)((long)ppvVar17 + -8) = 0x1208b9;
      fyn = fy_node_by_path_internal(pfVar5,path,sVar19,flags);
      break;
    case 2:
      local_40 = pfVar5;
      local_34 = flags;
      if ((fVar11 == FYNWF_PTR_JSON) || (fVar11 == FYNWF_PTR_RELJSON)) {
        bVar4 = false;
        for (sVar19 = 0; (path = pcVar23 + sVar19, path < pcVar13 && (*path != '/'));
            sVar19 = sVar19 + 1) {
          bVar4 = (bool)(bVar4 | *path == '~');
        }
        if (bVar4) {
          lVar6 = -(sVar19 + 0x10 & 0xfffffffffffffff0);
          ppvVar14 = (void **)((long)&local_68 + lVar6);
          *(undefined8 *)((long)&uStack_70 + lVar6) = 0x7e;
          uVar3 = *(undefined8 *)((long)&uStack_70 + lVar6);
          *(undefined8 *)((long)&uStack_70 + lVar6) = 0x2f;
          uVar2 = *(undefined8 *)((long)&uStack_70 + lVar6);
          sVar19 = 0;
          pcVar12 = pcVar23;
          while (pcVar23 = (char *)ppvVar14, pcVar12 < path) {
            pcVar23 = pcVar12 + 1;
            if (*pcVar12 == '~') {
              if (path <= pcVar23) {
                return (fy_node *)0x0;
              }
              cVar1 = (char)uVar2;
              if (pcVar12[1] == '0') {
                cVar1 = (char)uVar3;
              }
              *(char *)((long)ppvVar14 + sVar19) = cVar1;
              pcVar23 = pcVar12 + 2;
            }
            else {
              *(char *)((long)ppvVar14 + sVar19) = *pcVar12;
            }
            sVar19 = sVar19 + 1;
            pcVar12 = pcVar23;
          }
        }
        if ((local_34 >> 0x12 & 1) != 0) {
          *(char *)((long)ppvVar14 + -8) = '%';
          *(char *)((long)ppvVar14 + -7) = '\0';
          *(char *)((long)ppvVar14 + -6) = '\0';
          *(char *)((long)ppvVar14 + -5) = '\0';
          *(char *)((long)ppvVar14 + -4) = '\0';
          *(char *)((long)ppvVar14 + -3) = '\0';
          *(char *)((long)ppvVar14 + -2) = '\0';
          *(char *)((long)ppvVar14 + -1) = '\0';
          uVar3 = *(undefined8 *)((long)ppvVar14 + -8);
          *(char *)((long)ppvVar14 + -8) = -0x32;
          *(char *)((long)ppvVar14 + -7) = '\x05';
          *(char *)((long)ppvVar14 + -6) = '\x12';
          *(char *)((long)ppvVar14 + -5) = '\0';
          *(char *)((long)ppvVar14 + -4) = '\0';
          *(char *)((long)ppvVar14 + -3) = '\0';
          *(char *)((long)ppvVar14 + -2) = '\0';
          *(char *)((long)ppvVar14 + -1) = '\0';
          pvVar8 = memchr(pcVar23,(int)uVar3,sVar19);
          if (pvVar8 != (void *)0x0) {
            lVar6 = -(sVar19 + 0x10 & 0xfffffffffffffff0);
            pcVar12 = (char *)((long)ppvVar14 + lVar6);
            pcVar20 = pcVar23 + sVar19;
            local_60 = pcVar12;
            pcStack_48 = pcVar13;
            pcVar13 = pcVar12;
            while (pcVar23 < pcVar20) {
              pcVar12[-8] = '%';
              pcVar12[-7] = '\0';
              pcVar12[-6] = '\0';
              pcVar12[-5] = '\0';
              pcVar12[-4] = '\0';
              pcVar12[-3] = '\0';
              pcVar12[-2] = '\0';
              pcVar12[-1] = '\0';
              builtin_strncpy((char *)((long)ppvVar14 + lVar6 + -8),"\x0e\x06\x12",4);
              pcVar12[-4] = '\0';
              pcVar12[-3] = '\0';
              pcVar12[-2] = '\0';
              pcVar12[-1] = '\0';
              local_68 = memchr(pcVar23,(int)*(undefined8 *)(pcVar12 + -8),
                                (long)pcVar20 - (long)pcVar23);
              iVar18 = (int)pcVar20;
              if (local_68 != (void *)0x0) {
                iVar18 = (int)local_68;
              }
              sVar21 = (size_t)(iVar18 - (int)pcVar23);
              builtin_strncpy((char *)((long)ppvVar14 + lVar6 + -8),"/\x06\x12",4);
              pcVar12[-4] = '\0';
              pcVar12[-3] = '\0';
              pcVar12[-2] = '\0';
              pcVar12[-1] = '\0';
              memcpy(pcVar13,pcVar23,sVar21);
              pcVar13 = pcVar13 + sVar21;
              if (local_68 == (void *)0x0) break;
              end_idx._4_4_ = 4;
              builtin_strncpy((char *)((long)ppvVar14 + lVar6 + -8),"`\x06\x12",4);
              pcVar12[-4] = '\0';
              pcVar12[-3] = '\0';
              pcVar12[-2] = '\0';
              pcVar12[-1] = '\0';
              pcVar23 = fy_uri_esc(pcVar23 + sVar21,(long)pcVar20 - (long)(pcVar23 + sVar21),
                                   (uint8_t *)&local_58,(int *)((long)&end_idx + 4));
              if (pcVar23 == (char *)0x0) {
                return (fy_node *)0x0;
              }
              sVar21 = (size_t)end_idx._4_4_;
              builtin_strncpy((char *)((long)ppvVar14 + lVar6 + -8),"z\x06\x12",4);
              pcVar12[-4] = '\0';
              pcVar12[-3] = '\0';
              pcVar12[-2] = '\0';
              pcVar12[-1] = '\0';
              memcpy(pcVar13,&local_58,sVar21);
              pcVar13 = pcVar13 + sVar21;
            }
            sVar19 = (long)pcVar13 - (long)local_60;
            ppvVar14 = (void **)pcVar12;
            pcVar23 = local_60;
            pcVar13 = pcStack_48;
          }
        }
        pfVar5 = local_40;
        builtin_strncpy((char *)((long)ppvVar14 + -8),"u\a\x12",4);
        *(char *)((long)ppvVar14 + -4) = '\0';
        *(char *)((long)ppvVar14 + -3) = '\0';
        *(char *)((long)ppvVar14 + -2) = '\0';
        *(char *)((long)ppvVar14 + -1) = '\0';
        pfVar5 = fy_node_mapping_lookup_value_by_simple_key(pfVar5,pcVar23,sVar19);
        ppvVar15 = ppvVar14;
LAB_00120775:
        flags = local_34;
        sVar19 = (long)pcVar13 - (long)path;
        ppvVar17 = ppvVar15;
        if ((pcVar13 != path & (byte)local_38) == 1) {
          *(undefined8 *)((long)ppvVar15 + -8) = 1;
          single = (undefined1)*(undefined8 *)((long)ppvVar15 + -8);
          goto LAB_0012089d;
        }
        goto LAB_001208a8;
      }
      while ((path < pcVar13 && (cVar1 = *path, cVar1 != '/'))) {
        pcVar12 = path + 1;
        if (cVar1 == '\"') {
          while( true ) {
            pcVar20 = pcVar12;
            if (pcVar13 <= pcVar20) {
              return (fy_node *)0x0;
            }
            path = pcVar20 + 1;
            if (*pcVar20 == '\"') break;
            pcVar12 = path;
            if ((path < pcVar13 && *pcVar20 == '\\') && (pcVar20[1] == '\"')) {
              pcVar12 = pcVar20 + 2;
            }
          }
        }
        else if (cVar1 == '\\') {
          if (pcVar13 <= pcVar12) {
            return (fy_node *)0x0;
          }
          uStack_70 = 0x120516;
          pvVar8 = memchr("/*&.{}[]\\",(int)*pcVar12,10);
          if (pvVar8 == (void *)0x0) {
            return (fy_node *)0x0;
          }
          path = path + 2;
        }
        else {
          path = pcVar12;
          if (cVar1 == '\'') {
            do {
              if (pcVar13 <= pcVar12) {
                return (fy_node *)0x0;
              }
              path = pcVar12 + 1;
              cVar1 = *pcVar12;
              pcVar12 = path;
            } while (cVar1 != '\'');
          }
        }
      }
      sVar19 = (long)path - (long)pcVar23;
      uStack_70 = 0x1206e6;
      pfVar5 = fy_node_mapping_lookup_by_string(local_40,pcVar23,sVar19);
      ppvVar15 = &local_68;
      if (pfVar5 != (fy_node *)0x0) goto LAB_00120775;
      if ((local_34 & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON|FYNWF_FOLLOW)) != FYNWF_FOLLOW) {
LAB_0012079f:
        pfVar5 = (fy_node *)0x0;
        ppvVar15 = &local_68;
        goto LAB_00120775;
      }
      uStack_70 = 0x120713;
      fyn_00 = fy_node_mapping_lookup_by_string(local_40,"<<",2);
      if (fyn_00 != (fy_node *)0x0) {
        if ((fyn_00->field_0x34 & 3) == 1) {
          pcStack_48 = pcVar13;
          paVar22 = &fyn_00->field_12;
          fyn_01 = (fy_node *)paVar22;
          do {
            do {
              fyn_01 = (fy_node *)(fyn_01->node).next;
              if (fyn_01 == (fy_node *)paVar22) {
                fyn_01 = (fy_node *)0x0;
              }
              pfVar5 = fyn_00;
              ppvVar15 = &local_68;
              pcVar13 = pcStack_48;
              if (fyn_01 == (fy_node *)0x0) goto LAB_00120775;
            } while (((fyn_01->field_0x34 & 3) != 0) || (fyn_01->style != FYNS_ALIAS));
            uStack_70 = 0x1207e7;
            pfVar5 = fy_node_follow_aliases(fyn_01,local_34,false);
            uStack_70 = 0x1207f5;
            pfVar5 = fy_node_mapping_lookup_by_string(pfVar5,pcVar23,sVar19);
            fyn_00 = (fy_node *)0x0;
            ppvVar15 = &local_68;
            pcVar13 = pcStack_48;
          } while (pfVar5 == (fy_node *)0x0);
        }
        else {
          if (((fyn_00->field_0x34 & 3) != 0) || (fyn_00->style != FYNS_ALIAS)) goto LAB_0012079f;
          uStack_70 = 0x120743;
          pfVar5 = fy_node_follow_aliases(fyn_00,local_34,false);
          uStack_70 = 0x120751;
          pfVar5 = fy_node_mapping_lookup_by_string(pfVar5,pcVar23,sVar19);
          ppvVar15 = &local_68;
        }
        goto LAB_00120775;
      }
      fyn = (fy_node *)0x0;
      flags = local_34;
      break;
    case 3:
      uStack_70 = 0x12082f;
      __assert_fail("fy_node_is_mapping(fyn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                    ,0xe9f,
                    "struct fy_node *fy_node_by_path_internal(struct fy_node *, const char *, size_t, enum fy_node_walk_flags)"
                   );
    }
  }
  uVar9 = (ulong)local_38;
  ppvVar16 = ppvVar17;
LAB_0012082f:
  if ((pcVar13 != path & (byte)uVar9) == 1) {
    *(undefined8 *)((long)ppvVar16 + -8) = 1;
    uVar3 = *(undefined8 *)((long)ppvVar16 + -8);
    *(undefined8 *)((long)ppvVar16 + -8) = 0x120849;
    pfVar5 = fy_node_follow_aliases(fyn,flags,SUB81(uVar3,0));
    return pfVar5;
  }
  return fyn;
}

Assistant:

static struct fy_node *
fy_node_by_path_internal(struct fy_node *fyn,
                         const char *path, size_t pathlen,
                         enum fy_node_walk_flags flags) {
    enum fy_node_walk_flags ptr_flags;
    struct fy_node *fynt, *fyni;
    const char *s, *e, *ss, *ee;
    char *end_idx, *json_key, *t, *p, *uri_path;
    char c;
    int idx, rlen;
    size_t len, json_key_len, uri_path_len;
    bool has_json_key_esc;
    uint8_t code[4];
    int code_length;
    bool trailing_slash;

    if (!fyn || !path)
        return NULL;

    ptr_flags = flags & FYNWF_PTR(FYNWF_PTR_MASK);

    s = path;
    if (pathlen == (size_t) -1)
        pathlen = strlen(path);
    e = s + pathlen;

    /* a trailing slash works just like unix and symbolic links
	 * if it does not exist no symbolic link lookups are performed
	 * at the end of the operation.
	 * if it exists they are followed upon resolution
	 */
    trailing_slash = pathlen > 0 && path[pathlen - 1] == '/';

    /* and continue on path lookup with the rest */

    /* skip all prefixed / */
    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:
            while (s < e && *s == '/')
                s++;
            /* for a last component / always match this one */
            if (s >= e)
                goto out;
            break;

        case FYNWF_PTR_JSON:
            /* "" -> everything here */
            if (s == e)
                return fyn;
            /* it must have a separator here */
            if (*s != '/')
                return NULL;
            s++;
            break;

        case FYNWF_PTR_RELJSON:
            break;
    }

    /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
			__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
    fyn = fy_node_follow_aliases(fyn, flags, true);

    /* scalar can't match (it has no key) */
    if (fy_node_is_scalar(fyn)) {
        fyn = NULL;
        goto out;
    }

    /* for a sequence the only allowed key is [n] where n is the index to follow */
    if (fy_node_is_sequence(fyn)) {

        c = -1;
        switch (ptr_flags) {
            default:
            case FYNWF_PTR_YAML:
                while (s < e && isspace(*s))
                    s++;

                c = *s;
                if (c == '[')
                    s++;
                else if (!isdigit(c) && c != '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                s = end_idx;

                while (s < e && isspace(*s))
                    s++;

                if (c == '[' && *s++ != ']')
                    return NULL;

                while (s < e && isspace(*s))
                    s++;

                break;

            case FYNWF_PTR_JSON:
            case FYNWF_PTR_RELJSON:

                /* special array end - always fails */
                if (*s == '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                /* no negatives */
                if (idx < 0)
                    return NULL;

                s = end_idx;

                if (s < e && *s == '/')
                    s++;

                break;
        }

        len = e - s;

        fyn = fy_node_sequence_get_by_index(fyn, idx);
        if (trailing_slash)
            fyn = fy_node_follow_aliases(fyn, flags, false);
        fyn = fy_node_by_path_internal(fyn, s, len, flags);
        goto out;
    }

    /* be a little bit paranoid */
    assert(fy_node_is_mapping(fyn));

    path = s;
    pathlen = (size_t) (e - s);

    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:

            /* scan ahead for the end of the path component
		* note that we don't do UTF8 here, because all the
		* escapes are regular ascii characters, i.e.
		* '/', '*', '&', '.', '{', '}', '[', ']' and '\\'
		*/

            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;

                if (c == '\\') {
                    /* it must be a valid escape */
                    if (s >= e || !strchr("/*&.{}[]\\", *s))
                        return NULL;
                    s++;
                } else if (c == '"') {
                    while (s < e && *s != '"') {
                        c = *s++;
                        if (c == '\\' && (s < e && *s == '"'))
                            s++;
                    }
                    /* not a normal double quote end */
                    if (s >= e || *s != '"')
                        return NULL;
                    s++;
                } else if (c == '\'') {
                    while (s < e && *s != '\'') {
                        c = *s++;
                        if (c == '\'' && (s < e && *s == '\''))
                            s++;
                    }
                    /* not a normal single quote end */
                    if (s >= e || *s != '\'')
                        return NULL;
                    s++;
                }
            }
            len = s - path;

            fynt = fyn;
            fyn = fy_node_mapping_lookup_by_string(fyn, path, len);

            /* failed! last ditch attempt, is there a merge key? */
            if (!fyn && fynt && (flags & FYNWF_FOLLOW) && ptr_flags == FYNWF_PTR_YAML) {
                fyn = fy_node_mapping_lookup_by_string(fynt, "<<", 2);
                if (!fyn)
                    goto out;

                if (fy_node_is_alias(fyn)) {

                    /* single alias '<<: *foo' */
                    fyn = fy_node_mapping_lookup_by_string(
                            fy_node_follow_aliases(fyn, flags, false), path, len);

                } else if (fy_node_is_sequence(fyn)) {

                    /* multi aliases '<<: [ *foo, *bar ]' */
                    fynt = fyn;
                    for (fyni = fy_node_list_head(&fynt->sequence); fyni;
                         fyni = fy_node_next(&fynt->sequence, fyni)) {
                        if (!fy_node_is_alias(fyni))
                            continue;
                        fyn = fy_node_mapping_lookup_by_string(
                                fy_node_follow_aliases(fyni, flags, false),
                                path, len);
                        if (fyn)
                            break;
                    }
                } else
                    fyn = NULL;
            }
            break;

        case FYNWF_PTR_JSON:
        case FYNWF_PTR_RELJSON:

            has_json_key_esc = false;
            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;
                if (c == '~')
                    has_json_key_esc = true;
            }
            len = s - path;

            if (has_json_key_esc) {
                /* note that the escapes reduce the length, so allocating the
			 * same size is guaranteed safe */
                json_key = alloca(len + 1);

                ss = path;
                ee = s;
                t = json_key;
                while (ss < ee) {
                    if (*ss != '~') {
                        *t++ = *ss++;
                        continue;
                    }
                    /* unterminated ~ escape, or neither ~0, ~1 */
                    if (ss + 1 >= ee || (ss[1] < '0' && ss[1] > '1'))
                        return NULL;
                    *t++ = ss[1] == '0' ? '~' : '/';
                    ss += 2;
                }
                json_key_len = t - json_key;

                path = json_key;
                len = json_key_len;
            }

            /* URI encoded escaped */
            if ((flags & FYNWF_URI_ENCODED) && memchr(path, '%', len)) {
                /* escapes shrink, so safe to allocate as much */
                uri_path = alloca(len + 1);

                ss = path;
                ee = path + len;
                t = uri_path;
                while (ss < ee) {
                    /* copy run until '%' or end */
                    p = memchr(ss, '%', ee - ss);
                    rlen = (p ? p : ee) - ss;
                    memcpy(t, ss, rlen);
                    ss += rlen;
                    t += rlen;

                    /* if end, break */
                    if (!p)
                        break;

                    /* collect a utf8 character sequence */
                    code_length = sizeof(code);
                    ss = fy_uri_esc(ss, ee - ss, code, &code_length);
                    if (!ss) {
                        /* bad % escape sequence */
                        return NULL;
                    }
                    memcpy(t, code, code_length);
                    t += code_length;
                }
                uri_path_len = t - uri_path;

                path = uri_path;
                len = uri_path_len;
            }

            fynt = fyn;
            fyn = fy_node_mapping_lookup_value_by_simple_key(fyn, path, len);
            break;
    }

    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    fyn = fy_node_by_path_internal(fyn, s, len, flags);

    out:
    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    return fyn;
}